

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginComboPreview(void)

{
  ImGuiComboPreviewData *r;
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImVec2 IVar6;
  
  pIVar4 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if ((pIVar3->SkipItems == false) && (((GImGui->LastItemData).StatusFlags & 0x100) != 0)) {
    r = &GImGui->ComboPreviewData;
    bVar5 = ImRect::Overlaps(&pIVar3->ClipRect,&r->PreviewRect);
    if (bVar5) {
      (pIVar4->ComboPreviewData).BackupCursorPos = (pIVar3->DC).CursorPos;
      (pIVar4->ComboPreviewData).BackupCursorMaxPos = (pIVar3->DC).CursorMaxPos;
      (pIVar4->ComboPreviewData).BackupCursorPosPrevLine = (pIVar3->DC).CursorPosPrevLine;
      (pIVar4->ComboPreviewData).BackupPrevLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      (pIVar4->ComboPreviewData).BackupLayout = (pIVar3->DC).LayoutType;
      IVar1 = (pIVar4->ComboPreviewData).PreviewRect.Min;
      IVar2 = (pIVar4->Style).FramePadding;
      IVar6.x = IVar2.x + IVar1.x;
      IVar6.y = IVar2.y + IVar1.y;
      (pIVar3->DC).CursorPos = IVar6;
      (pIVar3->DC).CursorMaxPos = IVar6;
      (pIVar3->DC).LayoutType = 0;
      (pIVar3->DC).IsSameLine = false;
      PushClipRect((ImVec2 *)r,&(pIVar4->ComboPreviewData).PreviewRect.Max,true);
      return true;
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginComboPreview()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiComboPreviewData* preview_data = &g.ComboPreviewData;

    if (window->SkipItems || !(g.LastItemData.StatusFlags & ImGuiItemStatusFlags_Visible))
        return false;
    IM_ASSERT(g.LastItemData.Rect.Min.x == preview_data->PreviewRect.Min.x && g.LastItemData.Rect.Min.y == preview_data->PreviewRect.Min.y); // Didn't call after BeginCombo/EndCombo block or forgot to pass ImGuiComboFlags_CustomPreview flag?
    if (!window->ClipRect.Overlaps(preview_data->PreviewRect)) // Narrower test (optional)
        return false;

    // FIXME: This could be contained in a PushWorkRect() api
    preview_data->BackupCursorPos = window->DC.CursorPos;
    preview_data->BackupCursorMaxPos = window->DC.CursorMaxPos;
    preview_data->BackupCursorPosPrevLine = window->DC.CursorPosPrevLine;
    preview_data->BackupPrevLineTextBaseOffset = window->DC.PrevLineTextBaseOffset;
    preview_data->BackupLayout = window->DC.LayoutType;
    window->DC.CursorPos = preview_data->PreviewRect.Min + g.Style.FramePadding;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.LayoutType = ImGuiLayoutType_Horizontal;
    window->DC.IsSameLine = false;
    PushClipRect(preview_data->PreviewRect.Min, preview_data->PreviewRect.Max, true);

    return true;
}